

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O0

void triangularToSquareHessian
               (HighsHessian *hessian,vector<int,_std::allocator<int>_> *start,
               vector<int,_std::allocator<int>_> *index,
               vector<double,_std::allocator<double>_> *value)

{
  int iVar1;
  const_reference pvVar2;
  vector<int,_std::allocator<int>_> *this;
  reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int *in_RDI;
  HighsInt iCol_3;
  HighsInt toEl_1;
  HighsInt iRow_3;
  HighsInt iEl_2;
  HighsInt toEl;
  HighsInt iRow_2;
  HighsInt iEl_1;
  HighsInt iCol_2;
  HighsInt iCol_1;
  HighsInt iRow_1;
  HighsInt iEl;
  HighsInt iRow;
  HighsInt iCol;
  vector<int,_std::allocator<int>_> length;
  HighsInt square_nnz;
  HighsInt nnz;
  HighsInt dim;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  value_type vVar6;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar7;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  size_type in_stack_ffffffffffffff38;
  value_type vVar8;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_90;
  int local_84;
  int local_74;
  int local_70;
  int local_68;
  int local_60;
  vector<int,_std::allocator<int>_> local_48;
  int local_30;
  int local_2c;
  undefined4 local_28;
  int local_24;
  vector<double,_std::allocator<double>_> *local_20;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *local_10;
  int *local_8;
  
  local_24 = *in_RDI;
  if (local_24 < 1) {
    local_28 = 0;
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (value_type_conflict2 *)0x6b8cc7);
  }
  else {
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_24);
    local_2c = *pvVar2;
    local_30 = local_2c * 2 - local_24;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6b8d5e);
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (value_type_conflict2 *)0x6b8d83);
    for (local_60 = 0; local_60 < local_24; local_60 = local_60 + 1) {
      this = (vector<int,_std::allocator<int>_> *)(local_8 + 8);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_8 + 2),(long)local_60);
      std::vector<int,_std::allocator<int>_>::operator[](this,(long)*pvVar2);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_60);
      *pvVar3 = *pvVar3 + 1;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_8 + 2),(long)local_60);
      local_68 = *pvVar2;
      while( true ) {
        local_68 = local_68 + 1;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_8 + 2),(long)(local_60 + 1))
        ;
        if (*pvVar2 <= local_68) break;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_8 + 8),(long)local_68);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)*pvVar2);
        *pvVar3 = *pvVar3 + 1;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_60);
        *pvVar3 = *pvVar3 + 1;
      }
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,0);
    *pvVar3 = 0;
    for (local_70 = 0; local_70 < local_24; local_70 = local_70 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_70);
      iVar1 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_70);
      iVar7 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)(local_70 + 1));
      *pvVar3 = iVar1 + iVar7;
    }
    for (local_74 = 0; local_74 < local_24; local_74 = local_74 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_8 + 2),(long)local_74);
      iVar1 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_8 + 8),(long)iVar1);
      vVar6 = *pvVar2;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_74);
      iVar7 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)iVar7);
      *pvVar3 = vVar6;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_8 + 0xe),(long)iVar1);
      vVar8 = *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iVar7);
      *pvVar5 = vVar8;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_74);
      *pvVar3 = *pvVar3 + 1;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_8 + 2),(long)local_74);
      local_84 = *pvVar2;
      while( true ) {
        local_84 = local_84 + 1;
        iVar1 = local_84;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_8 + 2),(long)(local_74 + 1))
        ;
        if (*pvVar2 <= iVar1) break;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_8 + 8),(long)local_84);
        in_stack_ffffffffffffff34 = *pvVar2;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (local_10,(long)in_stack_ffffffffffffff34);
        iVar1 = *pvVar3;
        iVar7 = local_74;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)iVar1);
        *pvVar3 = iVar7;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_8 + 0xe),
                            (long)local_84);
        vVar8 = *pvVar4;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iVar1);
        *pvVar5 = vVar8;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (local_10,(long)in_stack_ffffffffffffff34);
        *pvVar3 = *pvVar3 + 1;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_74);
        iVar1 = *pvVar3;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)iVar1);
        *pvVar3 = in_stack_ffffffffffffff34;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_8 + 0xe),
                            (long)local_84);
        vVar8 = *pvVar4;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iVar1);
        *pvVar5 = vVar8;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_74);
        *pvVar3 = *pvVar3 + 1;
      }
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,0);
    *pvVar3 = 0;
    for (local_90 = 0; local_90 < local_24; local_90 = local_90 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_90);
      vVar6 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_90);
      iVar1 = vVar6 + *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)(local_90 + 1));
      *pvVar3 = iVar1;
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  return;
}

Assistant:

void triangularToSquareHessian(const HighsHessian& hessian,
                               vector<HighsInt>& start, vector<HighsInt>& index,
                               vector<double>& value) {
  const HighsInt dim = hessian.dim_;
  if (dim <= 0) {
    start.assign(1, 0);
    return;
  }
  assert(hessian.format_ == HessianFormat::kTriangular);
  const HighsInt nnz = hessian.start_[dim];
  const HighsInt square_nnz = nnz + (nnz - dim);
  start.resize(dim + 1);
  index.resize(square_nnz);
  value.resize(square_nnz);
  vector<HighsInt> length;
  length.assign(dim, 0);
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt iRow = hessian.index_[hessian.start_[iCol]];
    assert(iRow == iCol);
    length[iCol]++;
    for (HighsInt iEl = hessian.start_[iCol] + 1;
         iEl < hessian.start_[iCol + 1]; iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      assert(iRow > iCol);
      length[iRow]++;
      length[iCol]++;
    }
  }
  start[0] = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++)
    start[iCol + 1] = start[iCol] + length[iCol];
  assert(square_nnz == start[dim]);
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt iEl = hessian.start_[iCol];
    HighsInt iRow = hessian.index_[iEl];
    HighsInt toEl = start[iCol];
    index[toEl] = iRow;
    value[toEl] = hessian.value_[iEl];
    start[iCol]++;
    for (HighsInt iEl = hessian.start_[iCol] + 1;
         iEl < hessian.start_[iCol + 1]; iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      HighsInt toEl = start[iRow];
      index[toEl] = iCol;
      value[toEl] = hessian.value_[iEl];
      start[iRow]++;
      toEl = start[iCol];
      index[toEl] = iRow;
      value[toEl] = hessian.value_[iEl];
      start[iCol]++;
    }
  }
  start[0] = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++)
    start[iCol + 1] = start[iCol] + length[iCol];
}